

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O2

void crnlib::LzmaEnc_Init(CLzmaEnc *p)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  UInt16 (*paUVar4) [16];
  UInt16 (*paUVar5) [64];
  ulong uVar6;
  UInt32 j_1;
  UInt32 j;
  long lVar7;
  
  p->state = 0;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    p->reps[lVar3] = 0;
  }
  RangeEnc_Init(&p->rc);
  paUVar4 = p->isRep0Long;
  for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 1) {
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      paUVar4[-0xf][lVar7] = 0x400;
      (*paUVar4)[lVar7] = 0x400;
    }
    p->isRep[lVar3] = 0x400;
    p->isRepG0[lVar3] = 0x400;
    p->isRepG1[lVar3] = 0x400;
    p->isRepG2[lVar3] = 0x400;
    paUVar4 = paUVar4 + 1;
  }
  uVar1 = p->lc;
  uVar2 = p->lp;
  for (uVar6 = 0; (uint)(0x300 << ((char)uVar1 + (char)uVar2 & 0x1fU)) != uVar6; uVar6 = uVar6 + 1)
  {
    p->litProbs[uVar6] = 0x400;
  }
  paUVar5 = p->posSlotEncoder;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 1) {
      (*paUVar5)[lVar7] = 0x400;
    }
    paUVar5 = paUVar5 + 1;
  }
  for (lVar3 = 0; lVar3 != 0x72; lVar3 = lVar3 + 1) {
    p->posEncoders[lVar3] = 0x400;
  }
  LenEnc_Init(&(p->lenEnc).p);
  LenEnc_Init(&(p->repLenEnc).p);
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    p->posAlignEncoder[lVar3] = 0x400;
  }
  p->optimumEndIndex = 0;
  p->optimumCurrentIndex = 0;
  p->additionalOffset = 0;
  p->pbMask = ~(-1 << ((byte)p->pb & 0x1f));
  p->lpMask = ~(-1 << ((byte)p->lp & 0x1f));
  return;
}

Assistant:

void LzmaEnc_Init(CLzmaEnc* p) {
  UInt32 i;
  p->state = 0;
  for (i = 0; i < LZMA_NUM_REPS; i++)
    p->reps[i] = 0;

  RangeEnc_Init(&p->rc);

  for (i = 0; i < kNumStates; i++) {
    UInt32 j;
    for (j = 0; j < LZMA_NUM_PB_STATES_MAX; j++) {
      p->isMatch[i][j] = kProbInitValue;
      p->isRep0Long[i][j] = kProbInitValue;
    }
    p->isRep[i] = kProbInitValue;
    p->isRepG0[i] = kProbInitValue;
    p->isRepG1[i] = kProbInitValue;
    p->isRepG2[i] = kProbInitValue;
  }

  {
    UInt32 num = 0x300 << (p->lp + p->lc);
    for (i = 0; i < num; i++)
      p->litProbs[i] = kProbInitValue;
  }

  {
    for (i = 0; i < kNumLenToPosStates; i++) {
      CLzmaProb* probs = p->posSlotEncoder[i];
      UInt32 j;
      for (j = 0; j < (1 << kNumPosSlotBits); j++)
        probs[j] = kProbInitValue;
    }
  }
  {
    for (i = 0; i < kNumFullDistances - kEndPosModelIndex; i++)
      p->posEncoders[i] = kProbInitValue;
  }

  LenEnc_Init(&p->lenEnc.p);
  LenEnc_Init(&p->repLenEnc.p);

  for (i = 0; i < (1 << kNumAlignBits); i++)
    p->posAlignEncoder[i] = kProbInitValue;

  p->optimumEndIndex = 0;
  p->optimumCurrentIndex = 0;
  p->additionalOffset = 0;

  p->pbMask = (1 << p->pb) - 1;
  p->lpMask = (1 << p->lp) - 1;
}